

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_internal.h
# Opt level: O0

int duckdb_zstd::ZSTD_DCtx_get_bmi2(ZSTD_DCtx_s *dctx)

{
  ZSTD_DCtx_s *dctx_local;
  
  return dctx->bmi2;
}

Assistant:

MEM_STATIC int ZSTD_DCtx_get_bmi2(const struct ZSTD_DCtx_s *dctx) {
#if DYNAMIC_BMI2 != 0
	return dctx->bmi2;
#else
    (void)dctx;
	return 0;
#endif
}